

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_base.h
# Opt level: O0

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::GetPositionForDataId
          (MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,int data_id)

{
  PointAttribute *in_RSI;
  VectorD<long,_3> *in_RDI;
  AttributeValueIndex pos_val_id;
  PointIndex point_id;
  VectorD<long,_3> *pos;
  GeometryAttribute *this_00;
  VectorD<long,_3> *pVVar1;
  
  pVVar1 = in_RDI;
  PointAttribute::mapped_index(in_RSI,(PointIndex)(uint)in_RDI);
  VectorD<long,_3>::VectorD(in_RDI);
  this_00 = (GeometryAttribute *)(in_RSI->super_GeometryAttribute).buffer_descriptor_.buffer_id;
  VectorD<long,_3>::operator[](in_RDI,(int)((ulong)in_RSI >> 0x20));
  GeometryAttribute::ConvertValue<long>
            (this_00,(AttributeValueIndex)(uint)((ulong)pVVar1 >> 0x20),(long *)in_RDI);
  return pVVar1;
}

Assistant:

VectorD<int64_t, 3> GetPositionForDataId(int data_id) const {
    DRACO_DCHECK(this->IsInitialized());
    const auto point_id = entry_to_point_id_map_[data_id];
    const auto pos_val_id = pos_attribute_->mapped_index(point_id);
    VectorD<int64_t, 3> pos;
    pos_attribute_->ConvertValue(pos_val_id, &pos[0]);
    return pos;
  }